

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSense.c
# Opt level: O0

Abc_Obj_t * Abc_NtkSensitivityMiter_rec(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pNode)

{
  Abc_Aig_t *pMan;
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *p1;
  Abc_Obj_t *pNode_local;
  Abc_Ntk_t *pNtkNew_local;
  
  iVar1 = Abc_ObjIsComplement(pNode);
  if (iVar1 == 0) {
    if ((pNode->field_6).pTemp == (void *)0x0) {
      pAVar2 = Abc_ObjFanin0(pNode);
      Abc_NtkSensitivityMiter_rec(pNtkNew,pAVar2);
      pAVar2 = Abc_ObjFanin1(pNode);
      Abc_NtkSensitivityMiter_rec(pNtkNew,pAVar2);
      pMan = (Abc_Aig_t *)pNtkNew->pManFunc;
      pAVar2 = Abc_ObjChild0Copy(pNode);
      p1 = Abc_ObjChild1Copy(pNode);
      pNtkNew_local = (Abc_Ntk_t *)Abc_AigAnd(pMan,pAVar2,p1);
      (pNode->field_6).pCopy = (Abc_Obj_t *)pNtkNew_local;
    }
    else {
      pNtkNew_local = (Abc_Ntk_t *)(pNode->field_6).pCopy;
    }
    return (Abc_Obj_t *)pNtkNew_local;
  }
  __assert_fail("!Abc_ObjIsComplement(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcSense.c"
                ,0x30,"Abc_Obj_t *Abc_NtkSensitivityMiter_rec(Abc_Ntk_t *, Abc_Obj_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Copies the topmost levels of the network.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Obj_t * Abc_NtkSensitivityMiter_rec( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pNode )
{
    assert( !Abc_ObjIsComplement(pNode) );
    if ( pNode->pCopy )
        return pNode->pCopy;
    Abc_NtkSensitivityMiter_rec( pNtkNew, Abc_ObjFanin0(pNode) );
    Abc_NtkSensitivityMiter_rec( pNtkNew, Abc_ObjFanin1(pNode) );
    return pNode->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pNode), Abc_ObjChild1Copy(pNode) );
}